

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O3

void __thiscall
coins_tests::CacheTest::SimulationTest(CacheTest *this,CCoinsView *base,bool fake_best_block)

{
  COutPoint *outpoint;
  pointer puVar1;
  uchar *puVar2;
  long lVar3;
  pointer puVar4;
  readonly_property<bool> rVar5;
  readonly_property<bool> rVar6;
  byte bVar7;
  bool bVar8;
  readonly_property<bool> rVar9;
  readonly_property<bool> rVar10;
  readonly_property<bool> rVar11;
  readonly_property<bool> rVar12;
  readonly_property<bool> rVar13;
  uint uVar14;
  CCoinsViewCache *pCVar15;
  uint64_t uVar16;
  uint64_t uVar17;
  uint64_t uVar18;
  Coin *pCVar19;
  _Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> _Var20;
  _Base_ptr p_Var21;
  tuple<(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  this_00;
  readonly_property<bool> rVar22;
  int iVar23;
  element_type *this_01;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *test;
  CCoinsViewCacheTest *pCVar24;
  uint uVar25;
  iterator in_R8;
  iterator pvVar26;
  iterator in_R9;
  iterator pvVar27;
  pointer puVar28;
  pointer *__ptr;
  ulong uVar29;
  CCoinsViewCache *pCVar30;
  FastRandomContext *this_02;
  long in_FS_OFFSET;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  Span<std::byte> output_00;
  const_string file_07;
  Span<std::byte> output_01;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> txids;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  uint256 ret;
  value_type txid;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  check_type cVar36;
  undefined1 uVar31;
  undefined1 uVar32;
  uint uVar33;
  int local_56c;
  undefined1 uVar34;
  undefined8 uVar35;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  _Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> local_200;
  char *local_1f8;
  assertion_result local_1f0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> local_128;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  local_108;
  undefined1 local_e8 [8];
  element_type *peStack_e0;
  shared_count sStack_d8;
  _Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *p_Stack_d0;
  uint32_t local_c8;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  uint local_94;
  uint local_90;
  undefined1 local_88 [16];
  sp_counted_base *local_78;
  _Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *p_Stack_70;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar15 = (CCoinsViewCache *)operator_new(0x1c8);
  CCoinsViewCache::CCoinsViewCache(pCVar15,base,false);
  (pCVar15->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013af600;
  local_b8._0_8_ = pCVar15;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&local_108,(value_type *)local_b8);
  if ((CCoinsViewCache *)local_b8._0_8_ != (CCoinsViewCache *)0x0) {
    (*(((CCoinsViewCache *)local_b8._0_8_)->super_CCoinsViewBacked).super_CCoinsView.
      _vptr_CCoinsView[7])();
  }
  local_128.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
  resize(&local_128,5000);
  if (local_128.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar25 = 1;
    uVar29 = 0;
    do {
      local_a8 = (undefined1 *)0x0;
      uStack_a0 = (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)0x0;
      local_b8._0_8_ =
           (_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            )0x0;
      local_b8._8_8_ = (element_type *)0x0;
      output.m_size = 0x20;
      output.m_data = local_b8;
      FastRandomContext::fillrand(&(this->super_BasicTestingSetup).m_rng,output);
      puVar2 = local_128.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 0x10;
      *(undefined1 **)puVar2 = local_a8;
      *(undefined8 *)(puVar2 + 8) = uStack_a0;
      *(undefined8 *)
       local_128.
       super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = local_b8._0_8_;
      *(undefined8 *)
       (local_128.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = local_b8._8_8_;
      uVar29 = (ulong)uVar25;
      uVar25 = uVar25 + 1;
    } while (uVar29 < (ulong)((long)local_128.
                                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128.
                                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this_02 = &(this->super_BasicTestingSetup).m_rng;
  rVar5.super_class_property<bool>.value = (class_property<bool>)false;
  uVar25 = 0;
  uVar33 = 0;
  rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  rVar9.super_class_property<bool>.value = (class_property<bool>)false;
  rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  rVar13.super_class_property<bool>.value = (class_property<bool>)false;
  rVar22.super_class_property<bool>.value = (class_property<bool>)false;
  uVar35 = 0;
  local_56c = 0;
  do {
    uVar29 = ((long)local_128.
                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.
                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    if (uVar29 == 0) {
      uVar14 = 0x40;
    }
    else {
      lVar3 = 0x3f;
      if (uVar29 != 0) {
        for (; uVar29 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      uVar14 = (uint)lVar3 ^ 0x3f;
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,0x40 - uVar14);
    } while (uVar29 < uVar16);
    local_b8._0_8_ =
         *(undefined8 *)
          local_128.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].m_wrapped.super_base_blob<256U>.m_data.
          _M_elems;
    local_b8._8_8_ =
         *(undefined8 *)
          (local_128.
           super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar16].m_wrapped.super_base_blob<256U>.m_data.
           _M_elems + 8);
    puVar2 = local_128.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10;
    local_a8 = *(undefined1 **)puVar2;
    uStack_a0 = *(undefined8 *)(puVar2 + 8);
    local_98 = 0;
    local_88._0_8_ = local_b8._0_8_;
    local_88._8_8_ = local_b8._8_8_;
    local_78 = (sp_counted_base *)local_a8;
    p_Stack_70 = (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)uStack_a0;
    pCVar15 = (CCoinsViewCache *)
              std::
              map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
              ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                            *)&local_68,(key_type *)local_b8);
    uVar16 = RandomMixin<FastRandomContext>::randbits
                       (&this_02->super_RandomMixin<FastRandomContext>,2);
    uVar17 = RandomMixin<FastRandomContext>::randbits
                       (&this_02->super_RandomMixin<FastRandomContext>,2);
    if (uVar16 == 0) {
      pCVar24 = local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl;
      local_b8._0_8_ = local_88._0_8_;
      local_b8._8_8_ = local_88._8_8_;
      local_a8 = (undefined1 *)local_78;
      uStack_a0 = p_Stack_70;
      local_98 = 0;
      bVar7 = (**(code **)(*(long *)&(pCVar24->super_CCoinsViewCache).super_CCoinsViewBacked + 8))
                        (pCVar24,(key_type *)local_b8);
    }
    else {
      bVar7 = 0;
    }
    do {
      uVar18 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,9);
      puVar28 = local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (499 < uVar18);
    pCVar30 = &(local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
               _M_head_impl)->super_CCoinsViewCache;
    if (uVar18 == 0) {
      pCVar19 = AccessByTxid(pCVar30,(Txid *)local_88);
    }
    else {
      local_a8 = (undefined1 *)local_78;
      uStack_a0 = p_Stack_70;
      local_b8._0_8_ = local_88._0_8_;
      local_b8._8_8_ = local_88._8_8_;
      local_98 = 0;
      pCVar19 = CCoinsViewCache::AccessCoin(pCVar30,(COutPoint *)local_b8);
    }
    local_138 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xae;
    file.m_begin = (iterator)&local_138;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
    rVar6.super_class_property<bool>.value =
         (class_property<bool>)anon_unknown.dwarf_68223b::operator==((Coin *)pCVar15,pCVar19);
    peStack_e0 = (element_type *)0x0;
    sStack_d8.pi_ = (sp_counted_base *)0x0;
    local_1f0._0_8_ = "coin == entry";
    local_1f0.m_message.px = (element_type *)0xe73c4b;
    local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
    local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
    local_a8 = boost::unit_test::lazy_ostream::inst;
    uStack_a0 = &local_1f0;
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp";
    local_150 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    local_e8[0] = rVar6.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
               (size_t)&local_158,0xae);
    boost::detail::shared_count::~shared_count(&sStack_d8);
    if (uVar16 == 0) {
      local_168 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_160 = "";
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      local_170 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xb1;
      file_00.m_begin = (iterator)&local_168;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
                 msg_00);
      local_e8[0] = (class_property<bool>)(bVar7 ^ (pCVar19->out).nValue == -1);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_1f0._0_8_ = "result_havecoin == !entry.IsSpent()";
      local_1f0.m_message.px = (element_type *)0xe73c6f;
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = &local_1f0;
      local_188 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_180 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_188,0xb1);
      boost::detail::shared_count::~shared_count(&sStack_d8);
    }
    if (uVar17 == 0) {
      pCVar24 = puVar28[-1]._M_t.
                super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                ._M_t.
                super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                _M_head_impl;
      local_a8 = (undefined1 *)local_78;
      uStack_a0 = p_Stack_70;
      local_b8._0_8_ = local_88._0_8_;
      local_b8._8_8_ = local_88._8_8_;
      local_98 = 0;
      bVar7 = (**(code **)(*(long *)&(pCVar24->super_CCoinsViewCache).super_CCoinsViewBacked + 8))
                        (pCVar24,local_b8);
      local_198 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_190 = "";
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xb6;
      file_01.m_begin = (iterator)&local_198;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
                 msg_01);
      local_e8[0] = (class_property<bool>)(bVar7 ^ (pCVar19->out).nValue == -1);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_1f0._0_8_ = "ret == !entry.IsSpent()";
      local_1f0.m_message.px = (element_type *)0xe73c87;
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = &local_1f0;
      local_1b8 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_1b0 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_1b8,0xb6);
      boost::detail::shared_count::~shared_count(&sStack_d8);
    }
    do {
      this_01 = (element_type *)(local_b8 + 8);
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,3);
    } while (4 < uVar16);
    if ((uVar16 == 0) || (((CTxOut *)&pCVar15->super_CCoinsViewBacked)->nValue == -1)) {
      pCVar30 = pCVar15;
      CTxOut::CTxOut((CTxOut *)local_b8);
      local_90 = 0;
      do {
        _Var20._M_head_impl =
             (CCoinsViewCacheTest *)
             RandomMixin<FastRandomContext>::randbits
                       (&this_02->super_RandomMixin<FastRandomContext>,0x33);
      } while (2100000000000000 < _Var20._M_head_impl);
      local_90 = local_90 & 1 | 2;
      local_b8._0_8_ = _Var20._M_head_impl;
      do {
        uVar16 = RandomMixin<FastRandomContext>::randbits
                           (&this_02->super_RandomMixin<FastRandomContext>,4);
      } while (0xf < uVar16);
      lVar3 = ((CTxOut *)&pCVar15->super_CCoinsViewBacked)->nValue;
      uVar17 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,6);
      if ((uVar16 == 0) && (lVar3 == -1)) {
        local_e8[0] = (class_property<bool>)true;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this_01,(size_type)uVar17 + 1
                   ,local_e8);
        local_1c8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_1c0 = "";
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0xc1;
        file_03.m_begin = (iterator)&local_1c8;
        msg_03.m_end = in_R9;
        msg_03.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8
                   ,msg_03);
        uVar14 = local_94 - 0x1d;
        if (local_94 < 0x1d) {
          uVar14 = local_94;
        }
        if (uVar14 == 0) {
LAB_0032b3c8:
          bVar8 = 10000 < uVar14;
        }
        else {
          if (0x1c < local_94) {
            this_01 = (element_type *)local_b8._8_8_;
          }
          bVar8 = true;
          if (((direct_or_indirect *)&this_01->m_stream)->direct[0] != 'j') goto LAB_0032b3c8;
        }
        local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar8;
        local_1f0.m_message.px = (element_type *)0x0;
        local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_200._M_head_impl = (CCoinsViewCacheTest *)0xe73c88;
        local_1f8 = "";
        peStack_e0 = (element_type *)((ulong)peStack_e0 & 0xffffffffffffff00);
        local_e8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
        sStack_d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_d0 = &local_200;
        local_210 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_208 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        pCVar15 = pCVar30;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1f0,(lazy_ostream *)local_e8,1,0,WARN,_cVar36,(size_t)&local_210,0xc1);
        boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
        rVar10.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        local_e8 = (undefined1  [8])((ulong)(uint7)local_e8._1_7_ << 8);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this_01,(size_type)uVar17,
                   local_e8);
        lVar3 = ((CTxOut *)&pCVar30->super_CCoinsViewBacked)->nValue;
        ((CTxOut *)&pCVar30->super_CCoinsViewBacked)->nValue = local_b8._0_8_;
        pCVar15 = pCVar30;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(((CTxOut *)&pCVar30->super_CCoinsViewBacked)->scriptPubKey).super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)this_01);
        uVar33 = uVar33 & 0xff;
        if (lVar3 == -1) {
          uVar33 = 1;
        }
        else {
          rVar11.super_class_property<bool>.value = (class_property<bool>)true;
        }
        *(uint *)((pCVar30->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x17) = local_90;
      }
      bVar8 = true;
      if (((CTxOut *)&pCVar30->super_CCoinsViewBacked)->nValue == -1) {
        uVar16 = RandomMixin<FastRandomContext>::randbits<32>
                           (&this_02->super_RandomMixin<FastRandomContext>);
        bVar8 = (bool)((byte)uVar16 & 1);
      }
      sStack_d8.pi_ = local_78;
      p_Stack_d0 = p_Stack_70;
      local_e8 = (undefined1  [8])local_88._0_8_;
      peStack_e0 = (element_type *)local_88._8_8_;
      local_c8 = 0;
      CCoinsViewCache::AddCoin
                (&(puVar28[-1]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache,(COutPoint *)local_e8,(Coin *)local_b8,bVar8)
      ;
      if (0x1c < local_94) {
        free((void *)local_b8._8_8_);
      }
    }
    else {
      Coin::Clear((Coin *)pCVar15);
      local_220 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xcf;
      file_02.m_begin = (iterator)&local_220;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_230,
                 msg_02);
      local_a8 = (undefined1 *)local_78;
      uStack_a0 = p_Stack_70;
      local_b8._0_8_ = local_88._0_8_;
      local_b8._8_8_ = local_88._8_8_;
      local_98 = 0;
      bVar8 = CCoinsViewCache::SpendCoin
                        (&(puVar28[-1]._M_t.
                           super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           .
                           super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                          ._M_head_impl)->super_CCoinsViewCache,(COutPoint *)local_b8,(Coin *)0x0);
      local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar8;
      local_1f0.m_message.px = (element_type *)0x0;
      local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_200._M_head_impl = (CCoinsViewCacheTest *)0xe73cb1;
      local_1f8 = "";
      peStack_e0 = (element_type *)((ulong)peStack_e0 & 0xffffffffffffff00);
      local_e8 = (undefined1  [8])&PTR__lazy_ostream_013ae1c8;
      sStack_d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      p_Stack_d0 = &local_200;
      local_240 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_238 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1f0,(lazy_ostream *)local_e8,1,0,WARN,_cVar36,(size_t)&local_240,0xcf);
      boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
      rVar9.super_class_property<bool>.value = (class_property<bool>)true;
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,4);
    } while (9 < uVar16);
    if (uVar16 == 0) {
      uVar16 = RandomMixin<FastRandomContext>::randbits<32>
                         (&this_02->super_RandomMixin<FastRandomContext>);
      uVar29 = (uVar16 & 0xffffffff) %
               (ulong)((long)local_128.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_128.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_b8._0_8_ =
           *(undefined8 *)
            local_128.
            super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.m_data
            ._M_elems;
      local_b8._8_8_ =
           *(undefined8 *)
            (local_128.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8);
      puVar2 = local_128.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 0x10;
      local_a8 = *(undefined1 **)puVar2;
      uStack_a0 = *(undefined8 *)(puVar2 + 8);
      local_98 = 0;
      uVar16 = RandomMixin<FastRandomContext>::randbits<32>
                         (&this_02->super_RandomMixin<FastRandomContext>);
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar23 = (int)((uVar16 & 0xffffffff) %
                    (ulong)((long)puVar28 -
                            (long)local_108.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3));
      CCoinsViewCache::Uncache
                (&(local_108.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar23]._M_t.
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl)->super_CCoinsViewCache,(COutPoint *)local_b8);
      bVar8 = CCoinsViewCache::HaveCoinInCache
                        (&(puVar4[iVar23]._M_t.
                           super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                           .
                           super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                          ._M_head_impl)->super_CCoinsViewCache,(COutPoint *)local_b8);
      rVar22.super_class_property<bool>.value =
           (class_property<bool>)((byte)rVar22.super_class_property<bool>.value | !bVar8);
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,10);
    } while (999 < uVar16);
    if (local_56c == 39999 || uVar16 == 1) {
      p_Var21 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((_Rb_tree_header *)local_68._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_68._M_impl.super__Rb_tree_header) {
        do {
          outpoint = (COutPoint *)(p_Var21 + 1);
          pCVar24 = local_108.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                    _M_head_impl;
          bVar7 = (**(code **)(*(long *)&(pCVar24->super_CCoinsViewCache).super_CCoinsViewBacked + 8
                              ))(pCVar24,outpoint);
          pCVar19 = CCoinsViewCache::AccessCoin
                              (&(local_108.
                                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                 .
                                 super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl)->super_CCoinsViewCache,outpoint);
          local_250 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_248 = "";
          local_260 = &boost::unit_test::basic_cstring<char_const>::null;
          local_258 = &boost::unit_test::basic_cstring<char_const>::null;
          file_04.m_end = (iterator)0xe0;
          file_04.m_begin = (iterator)&local_250;
          msg_04.m_end = in_R9;
          msg_04.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                     (size_t)&local_260,msg_04);
          peStack_e0 = (element_type *)0x0;
          sStack_d8.pi_ = (sp_counted_base *)0x0;
          local_88._0_8_ = "have == !coin.IsSpent()";
          local_88._8_8_ = "";
          local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
          local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
          local_a8 = boost::unit_test::lazy_ostream::inst;
          uStack_a0 = local_88;
          local_270 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_268 = "";
          pvVar26 = (iterator)0x1;
          pvVar27 = (iterator)0x0;
          local_e8[0] = (class_property<bool>)
                        (class_property<bool>)(bVar7 ^ (pCVar19->out).nValue == -1);
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                     (size_t)&local_270,0xe0);
          boost::detail::shared_count::~shared_count(&sStack_d8);
          local_280 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_278 = "";
          local_290 = &boost::unit_test::basic_cstring<char_const>::null;
          local_288 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0xe1;
          file_05.m_begin = (iterator)&local_280;
          msg_05.m_end = pvVar27;
          msg_05.m_begin = pvVar26;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_290,msg_05);
          local_e8[0] = (class_property<bool>)
                        anon_unknown.dwarf_68223b::operator==(pCVar19,(Coin *)&p_Var21[2]._M_parent)
          ;
          peStack_e0 = (element_type *)0x0;
          sStack_d8.pi_ = (sp_counted_base *)0x0;
          local_88._0_8_ = "coin == entry.second";
          local_88._8_8_ = "";
          local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
          local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
          local_a8 = boost::unit_test::lazy_ostream::inst;
          uStack_a0 = local_88;
          local_2a0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_298 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                     (size_t)&local_2a0,0xe1);
          boost::detail::shared_count::~shared_count(&sStack_d8);
          if ((pCVar19->out).nValue == -1) {
            rVar13.super_class_property<bool>.value = (class_property<bool>)true;
          }
          else {
            local_2b0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
            ;
            local_2a8 = "";
            local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
            file_06.m_end = (iterator)0xe5;
            file_06.m_begin = (iterator)&local_2b0;
            msg_06.m_end = in_R9;
            msg_06.m_begin = in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                       (size_t)&local_2c0,msg_06);
            bVar8 = CCoinsViewCache::HaveCoinInCache
                              (&(local_108.
                                 super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                                 super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                                 .
                                 super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>
                                ._M_head_impl)->super_CCoinsViewCache,outpoint);
            local_e8[0] = (class_property<bool>)(class_property<bool>)bVar8;
            peStack_e0 = (element_type *)0x0;
            sStack_d8.pi_ = (sp_counted_base *)0x0;
            local_88._0_8_ = "stack.back()->HaveCoinInCache(entry.first)";
            local_88._8_8_ = "";
            local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
            local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
            local_a8 = boost::unit_test::lazy_ostream::inst;
            uStack_a0 = local_88;
            local_2d0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
            ;
            local_2c8 = "";
            in_R8 = (iterator)0x1;
            in_R9 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                       (size_t)&local_2d0,0xe5);
            boost::detail::shared_count::~shared_count(&sStack_d8);
            rVar12.super_class_property<bool>.value = (class_property<bool>)true;
          }
          p_Var21 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var21);
          puVar4 = local_108.
                   super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar28 = local_108.
                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        } while ((_Rb_tree_header *)p_Var21 != &local_68._M_impl.super__Rb_tree_header);
      }
      for (; puVar4 != puVar28; puVar4 = puVar4 + 1) {
        anon_unknown.dwarf_68223b::CCoinsViewCacheTest::SelfTest
                  ((puVar4->_M_t).
                   super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                   .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                   _M_head_impl,true);
      }
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,7);
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (99 < uVar16);
    if (((uVar16 == 0) &&
        (uVar29 = (long)puVar28 -
                  (long)local_108.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3, 1 < uVar29)) &&
       (uVar16 = RandomMixin<FastRandomContext>::randbits<1>
                           (&this_02->super_RandomMixin<FastRandomContext>), uVar16 == 0)) {
      uVar29 = uVar29 - 2;
      if (uVar29 == 0) {
        uVar14 = 0x40;
      }
      else {
        lVar3 = 0x3f;
        if (uVar29 != 0) {
          for (; uVar29 >> lVar3 == 0; lVar3 = lVar3 + -1) {
          }
        }
        uVar14 = (uint)lVar3 ^ 0x3f;
      }
      do {
        uVar16 = RandomMixin<FastRandomContext>::randbits
                           (&this_02->super_RandomMixin<FastRandomContext>,0x40 - uVar14);
      } while (uVar29 < uVar16);
      if (fake_best_block) {
        pCVar15 = &(puVar4[uVar16 & 0xffffffff]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                   _M_head_impl)->super_CCoinsViewCache;
        local_a8 = (undefined1 *)0x0;
        uStack_a0 = (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)0x0;
        local_b8._0_8_ =
             (_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
              )0x0;
        local_b8._8_8_ = (element_type *)0x0;
        output_01.m_size = 0x20;
        output_01.m_data = (byte *)local_b8;
        FastRandomContext::fillrand(this_02,output_01);
        CCoinsViewCache::SetBestBlock(pCVar15,(uint256 *)local_b8);
      }
      do {
        uVar17 = RandomMixin<FastRandomContext>::randbits
                           (&this_02->super_RandomMixin<FastRandomContext>,2);
      } while (3 < uVar17);
      local_2e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0xf4;
      file_08.m_begin = (iterator)&local_2e0;
      msg_08.m_end = in_R9;
      msg_08.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
                 msg_08);
      pCVar30 = &(puVar4[uVar16 & 0xffffffff]._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl)->super_CCoinsViewCache;
      if (uVar17 == 3) {
        bVar8 = CCoinsViewCache::Sync(pCVar30);
      }
      else {
        bVar8 = CCoinsViewCache::Flush(pCVar30);
      }
      local_e8[0] = (class_property<bool>)(class_property<bool>)bVar8;
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync()";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_300 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_2f8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_300,0xf4);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      uVar35 = CONCAT71((int7)((ulong)uVar35 >> 8),(byte)uVar35 | uVar17 == 3);
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_02->super_RandomMixin<FastRandomContext>,7);
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (99 < uVar16);
    if (uVar16 == 0) {
      if ((puVar28 !=
           local_108.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (uVar16 = RandomMixin<FastRandomContext>::randbits<1>
                             (&this_02->super_RandomMixin<FastRandomContext>), uVar16 == 0)) {
        if (fake_best_block) {
          pCVar30 = &(puVar28[-1]._M_t.
                      super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                     _M_head_impl)->super_CCoinsViewCache;
          local_a8 = (undefined1 *)0x0;
          uStack_a0 = (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)0x0;
          local_b8._0_8_ =
               (_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                )0x0;
          local_b8._8_8_ = (element_type *)0x0;
          output_00.m_size = 0x20;
          output_00.m_data = (byte *)local_b8;
          FastRandomContext::fillrand(this_02,output_00);
          CCoinsViewCache::SetBestBlock(pCVar30,(uint256 *)local_b8);
        }
        do {
          uVar16 = RandomMixin<FastRandomContext>::randbits
                             (&this_02->super_RandomMixin<FastRandomContext>,2);
        } while (3 < uVar16);
        local_310 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_308 = "";
        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
        local_318 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0xfe;
        file_07.m_begin = (iterator)&local_310;
        msg_07.m_end = in_R9;
        msg_07.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_320
                   ,msg_07);
        pCVar30 = &(puVar28[-1]._M_t.
                    super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                    .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                   _M_head_impl)->super_CCoinsViewCache;
        if (uVar16 == 3) {
          bVar8 = CCoinsViewCache::Sync(pCVar30);
        }
        else {
          bVar8 = CCoinsViewCache::Flush(pCVar30);
        }
        local_e8[0] = (class_property<bool>)(class_property<bool>)bVar8;
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        local_88._0_8_ = "should_erase ? stack.back()->Flush() : stack.back()->Sync()";
        local_88._8_8_ = "";
        local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
        local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
        local_a8 = boost::unit_test::lazy_ostream::inst;
        uStack_a0 = local_88;
        local_330 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_328 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                   (size_t)&local_330,0xfe);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        puVar1 = puVar28 + -1;
        pCVar24 = puVar28[-1]._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl;
        local_108.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = puVar1;
        if (pCVar24 != (CCoinsViewCacheTest *)0x0) {
          (**(code **)(*(long *)&(pCVar24->super_CCoinsViewCache).super_CCoinsViewBacked + 0x38))();
        }
        uVar35 = CONCAT71((int7)((ulong)uVar35 >> 8),(byte)uVar35 | uVar16 == 3);
        (puVar1->_M_t).
        super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        ._M_t.
        super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
        .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
             (CCoinsViewCacheTest *)0x0;
        puVar28 = local_108.
                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (puVar28 == puVar4) {
        rVar5.super_class_property<bool>.value = (class_property<bool>)true;
        pCVar24 = (CCoinsViewCacheTest *)base;
      }
      else {
        if ((0x1f < (ulong)((long)puVar28 - (long)puVar4)) ||
           (uVar16 = RandomMixin<FastRandomContext>::randbits<1>
                               (&this_02->super_RandomMixin<FastRandomContext>), uVar16 == 0))
        goto LAB_0032bdb2;
        pCVar24 = puVar28[-1]._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                  _M_head_impl;
      }
      this_00.
      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            )operator_new(0x1c8);
      CCoinsViewCache::CCoinsViewCache
                ((CCoinsViewCache *)
                 this_00.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl,(CCoinsView *)pCVar24,false);
      *(undefined ***)
       this_00.
       super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
           &PTR_GetCoin_013af600;
      local_b8._0_8_ =
           this_00.
           super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::push_back(&local_108,(value_type *)local_b8);
      if ((_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           )local_b8._0_8_ != (CCoinsViewCacheTest *)0x0) {
        (**(code **)(*(long *)local_b8._0_8_ + 0x38))();
      }
      uVar25 = uVar25 & 0xff;
      if ((long)local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        uVar25 = 1;
      }
    }
LAB_0032bdb2:
    local_56c = local_56c + 1;
    if (local_56c == 40000) {
      local_340 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_338 = "";
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      file_09.m_end = (iterator)0x113;
      file_09.m_begin = (iterator)&local_340;
      msg_09.m_end = in_R9;
      msg_09.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_350,
                 msg_09);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "removed_all_caches";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_360 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_358 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar5.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_360,0x113,uVar25,uVar33,pCVar15,uVar35);
      uVar34 = (undefined1)uVar35;
      uVar32 = (undefined1)uVar33;
      uVar31 = (undefined1)uVar25;
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_370 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_368 = "";
      local_380 = &boost::unit_test::basic_cstring<char_const>::null;
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x114;
      file_10.m_begin = (iterator)&local_370;
      msg_10.m_end = pvVar27;
      msg_10.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_380,
                 msg_10);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,uVar31) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "reached_4_caches";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_390 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_388 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_390,0x114);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_3a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_398 = "";
      local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x115;
      file_11.m_begin = (iterator)&local_3a0;
      msg_11.m_end = pvVar27;
      msg_11.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3b0,
                 msg_11);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,uVar32) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "added_an_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_3c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3b8 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_3c0,0x115);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_3d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3c8 = "";
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x116;
      file_12.m_begin = (iterator)&local_3d0;
      msg_12.m_end = pvVar27;
      msg_12.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3e0,
                 msg_12);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "added_an_unspendable_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_3f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3e8 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar10.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_3f0,0x116);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_400 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3f8 = "";
      local_410 = &boost::unit_test::basic_cstring<char_const>::null;
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x117;
      file_13.m_begin = (iterator)&local_400;
      msg_13.m_end = pvVar27;
      msg_13.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_410,
                 msg_13);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "removed_an_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_420 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_418 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar9.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_420,0x117);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_430 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_428 = "";
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      file_14.m_end = (iterator)0x118;
      file_14.m_begin = (iterator)&local_430;
      msg_14.m_end = pvVar27;
      msg_14.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_440,
                 msg_14);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "updated_an_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_450 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_448 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar11.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_450,0x118);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_460 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_458 = "";
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      local_468 = &boost::unit_test::basic_cstring<char_const>::null;
      file_15.m_end = (iterator)0x119;
      file_15.m_begin = (iterator)&local_460;
      msg_15.m_end = pvVar27;
      msg_15.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_470,
                 msg_15);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "found_an_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_480 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_478 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar12.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_480,0x119);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_490 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_488 = "";
      local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_498 = &boost::unit_test::basic_cstring<char_const>::null;
      file_16.m_end = (iterator)0x11a;
      file_16.m_begin = (iterator)&local_490;
      msg_16.m_end = pvVar27;
      msg_16.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4a0,
                 msg_16);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "missed_an_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_4b0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4a8 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar13.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_4b0,0x11a);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_4c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4b8 = "";
      local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_17.m_end = (iterator)0x11b;
      file_17.m_begin = (iterator)&local_4c0;
      msg_17.m_end = pvVar27;
      msg_17.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4d0,
                 msg_17);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "uncached_an_entry";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_4e0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4d8 = "";
      pvVar26 = (iterator)0x1;
      pvVar27 = (iterator)0x0;
      local_e8[0] = rVar22.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_4e0,0x11b);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_4f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4e8 = "";
      local_500 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_18.m_end = (iterator)0x11c;
      file_18.m_begin = (iterator)&local_4f0;
      msg_18.m_end = pvVar27;
      msg_18.m_begin = pvVar26;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_500,
                 msg_18);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,uVar34) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "flushed_without_erase";
      local_88._8_8_ = "";
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffffffffff00;
      local_b8._0_8_ = &PTR__lazy_ostream_013ae1c8;
      local_a8 = boost::unit_test::lazy_ostream::inst;
      uStack_a0 = local_88;
      local_510 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_508 = "";
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,_cVar36,
                 (size_t)&local_510,0x11c);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      if (local_128.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.
                        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::~vector(&local_108);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&local_68);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

void SimulationTest(CCoinsView* base, bool fake_best_block)
{
    // Various coverage trackers.
    bool removed_all_caches = false;
    bool reached_4_caches = false;
    bool added_an_entry = false;
    bool added_an_unspendable_entry = false;
    bool removed_an_entry = false;
    bool updated_an_entry = false;
    bool found_an_entry = false;
    bool missed_an_entry = false;
    bool uncached_an_entry = false;
    bool flushed_without_erase = false;

    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(base)); // Start with one cache.

    // Use a limited set of random transaction ids, so we do test overwriting entries.
    std::vector<Txid> txids;
    txids.resize(NUM_SIMULATION_ITERATIONS / 8);
    for (unsigned int i = 0; i < txids.size(); i++) {
        txids[i] = Txid::FromUint256(m_rng.rand256());
    }

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        // Do a random modification.
        {
            auto txid = txids[m_rng.randrange(txids.size())]; // txid we're going to modify in this iteration.
            Coin& coin = result[COutPoint(txid, 0)];

            // Determine whether to test HaveCoin before or after Access* (or both). As these functions
            // can influence each other's behaviour by pulling things into the cache, all combinations
            // are tested.
            bool test_havecoin_before = m_rng.randbits(2) == 0;
            bool test_havecoin_after = m_rng.randbits(2) == 0;

            bool result_havecoin = test_havecoin_before ? stack.back()->HaveCoin(COutPoint(txid, 0)) : false;

            // Infrequently, test usage of AccessByTxid instead of AccessCoin - the
            // former just delegates to the latter and returns the first unspent in a txn.
            const Coin& entry = (m_rng.randrange(500) == 0) ?
                AccessByTxid(*stack.back(), txid) : stack.back()->AccessCoin(COutPoint(txid, 0));
            BOOST_CHECK(coin == entry);

            if (test_havecoin_before) {
                BOOST_CHECK(result_havecoin == !entry.IsSpent());
            }

            if (test_havecoin_after) {
                bool ret = stack.back()->HaveCoin(COutPoint(txid, 0));
                BOOST_CHECK(ret == !entry.IsSpent());
            }

            if (m_rng.randrange(5) == 0 || coin.IsSpent()) {
                Coin newcoin;
                newcoin.out.nValue = RandMoney(m_rng);
                newcoin.nHeight = 1;

                // Infrequently test adding unspendable coins.
                if (m_rng.randrange(16) == 0 && coin.IsSpent()) {
                    newcoin.out.scriptPubKey.assign(1 + m_rng.randbits(6), OP_RETURN);
                    BOOST_CHECK(newcoin.out.scriptPubKey.IsUnspendable());
                    added_an_unspendable_entry = true;
                } else {
                    // Random sizes so we can test memory usage accounting
                    newcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
                    (coin.IsSpent() ? added_an_entry : updated_an_entry) = true;
                    coin = newcoin;
                }
                bool is_overwrite = !coin.IsSpent() || m_rng.rand32() & 1;
                stack.back()->AddCoin(COutPoint(txid, 0), std::move(newcoin), is_overwrite);
            } else {
                // Spend the coin.
                removed_an_entry = true;
                coin.Clear();
                BOOST_CHECK(stack.back()->SpendCoin(COutPoint(txid, 0)));
            }
        }

        // Once every 10 iterations, remove a random entry from the cache
        if (m_rng.randrange(10) == 0) {
            COutPoint out(txids[m_rng.rand32() % txids.size()], 0);
            int cacheid = m_rng.rand32() % stack.size();
            stack[cacheid]->Uncache(out);
            uncached_an_entry |= !stack[cacheid]->HaveCoinInCache(out);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
                if (coin.IsSpent()) {
                    missed_an_entry = true;
                } else {
                    BOOST_CHECK(stack.back()->HaveCoinInCache(entry.first));
                    found_an_entry = true;
                }
            }
            for (const auto& test : stack) {
                test->SelfTest();
            }
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                if (fake_best_block) stack[flushIndex]->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync());
                flushed_without_erase |= !should_erase;
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                //Remove the top cache
                if (fake_best_block) stack.back()->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack.back()->Flush() : stack.back()->Sync());
                flushed_without_erase |= !should_erase;
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                //Add a new cache
                CCoinsView* tip = base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                } else {
                    removed_all_caches = true;
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
                if (stack.size() == 4) {
                    reached_4_caches = true;
                }
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(removed_all_caches);
    BOOST_CHECK(reached_4_caches);
    BOOST_CHECK(added_an_entry);
    BOOST_CHECK(added_an_unspendable_entry);
    BOOST_CHECK(removed_an_entry);
    BOOST_CHECK(updated_an_entry);
    BOOST_CHECK(found_an_entry);
    BOOST_CHECK(missed_an_entry);
    BOOST_CHECK(uncached_an_entry);
    BOOST_CHECK(flushed_without_erase);
}